

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8_t * google::protobuf::internal::InternalSerializeMapEntry
                    (FieldDescriptor *field,MapKey *key,MapValueConstRef *value,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  bool value_00;
  int32_t iVar1;
  uint32_t uVar2;
  int iVar3;
  Descriptor *pDVar4;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  size_t sVar5;
  size_t sVar6;
  uint8_t *puVar7;
  size_t __n;
  MessageLite *pMVar8;
  int64_t iVar9;
  uint64_t uVar10;
  float value_01;
  double value_02;
  string_view s;
  
  pDVar4 = FieldDescriptor::message_type(field);
  field_00 = Descriptor::field(pDVar4,0);
  pDVar4 = FieldDescriptor::message_type(field);
  field_01 = Descriptor::field(pDVar4,1);
  sVar5 = MapKeyDataOnlyByteSize(field_00,key);
  sVar6 = MapValueRefDataOnlyByteSize(field_01,value);
  puVar7 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
  puVar7 = WireFormatLite::WriteTagToArray(field->number_,WIRETYPE_LENGTH_DELIMITED,puVar7);
  puVar7 = io::CodedOutputStream::WriteVarint32ToArray((int)sVar5 + (int)sVar6 + 2,puVar7);
  puVar7 = SerializeMapKeyWithCachedSizes(field_00,key,puVar7,stream);
  puVar7 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar7);
  switch(field_01->type_) {
  case '\x01':
    value_02 = MapValueConstRef::GetDoubleValue(value);
    puVar7 = WireFormatLite::WriteDoubleToArray(2,value_02,puVar7);
    return puVar7;
  case '\x02':
    value_01 = MapValueConstRef::GetFloatValue(value);
    puVar7 = WireFormatLite::WriteFloatToArray(2,value_01,puVar7);
    return puVar7;
  case '\x03':
    iVar9 = MapValueConstRef::GetInt64Value(value);
    puVar7 = WireFormatLite::WriteInt64ToArray(2,iVar9,puVar7);
    return puVar7;
  case '\x04':
    uVar10 = MapValueConstRef::GetUInt64Value(value);
    puVar7 = WireFormatLite::WriteUInt64ToArray(2,uVar10,puVar7);
    return puVar7;
  case '\x05':
    iVar1 = MapValueConstRef::GetInt32Value(value);
    puVar7 = WireFormatLite::WriteInt32ToArray(2,iVar1,puVar7);
    return puVar7;
  case '\x06':
    uVar10 = MapValueConstRef::GetUInt64Value(value);
    puVar7 = WireFormatLite::WriteFixed64ToArray(2,uVar10,puVar7);
    return puVar7;
  case '\a':
    uVar2 = MapValueConstRef::GetUInt32Value(value);
    puVar7 = WireFormatLite::WriteFixed32ToArray(2,uVar2,puVar7);
    return puVar7;
  case '\b':
    value_00 = MapValueConstRef::GetBoolValue(value);
    puVar7 = WireFormatLite::WriteBoolToArray(2,value_00,puVar7);
    return puVar7;
  case '\t':
  case '\f':
    s = MapValueConstRef::GetStringValue(value);
    __n = s._M_len;
    if ((0x7f < (long)__n) || ((long)(stream->end_ + (0xe - (long)puVar7)) < (long)__n)) {
      puVar7 = io::EpsCopyOutputStream::WriteStringOutline(stream,2,s,puVar7);
      return puVar7;
    }
    *puVar7 = '\x12';
    puVar7[1] = (uint8_t)s._M_len;
    memcpy(puVar7 + 2,s._M_str,__n);
    puVar7 = puVar7 + __n + 2;
    break;
  case '\n':
    pMVar8 = &MapValueConstRef::GetMessageValue(value)->super_MessageLite;
    puVar7 = WireFormatLite::InternalWriteGroup(2,pMVar8,puVar7,stream);
    return puVar7;
  case '\v':
    pMVar8 = &MapValueConstRef::GetMessageValue(value)->super_MessageLite;
    iVar3 = MessageLite::GetCachedSize(pMVar8);
    puVar7 = WireFormatLite::InternalWriteMessage(2,pMVar8,iVar3,puVar7,stream);
    return puVar7;
  case '\r':
    uVar2 = MapValueConstRef::GetUInt32Value(value);
    puVar7 = WireFormatLite::WriteUInt32ToArray(2,uVar2,puVar7);
    return puVar7;
  case '\x0e':
    iVar3 = MapValueConstRef::GetEnumValue(value);
    puVar7 = WireFormatLite::WriteEnumToArray(2,iVar3,puVar7);
    return puVar7;
  case '\x0f':
    iVar1 = MapValueConstRef::GetInt32Value(value);
    puVar7 = WireFormatLite::WriteSFixed32ToArray(2,iVar1,puVar7);
    return puVar7;
  case '\x10':
    iVar9 = MapValueConstRef::GetInt64Value(value);
    puVar7 = WireFormatLite::WriteSFixed64ToArray(2,iVar9,puVar7);
    return puVar7;
  case '\x11':
    iVar1 = MapValueConstRef::GetInt32Value(value);
    puVar7 = WireFormatLite::WriteSInt32ToArray(2,iVar1,puVar7);
    return puVar7;
  case '\x12':
    iVar9 = MapValueConstRef::GetInt64Value(value);
    puVar7 = WireFormatLite::WriteSInt64ToArray(2,iVar9,puVar7);
    return puVar7;
  }
  return puVar7;
}

Assistant:

static uint8_t* InternalSerializeMapEntry(const FieldDescriptor* field,
                                          const MapKey& key,
                                          const MapValueConstRef& value,
                                          uint8_t* target,
                                          io::EpsCopyOutputStream* stream) {
  const FieldDescriptor* key_field = field->message_type()->field(0);
  const FieldDescriptor* value_field = field->message_type()->field(1);

  size_t size = kMapEntryTagByteSize;
  size += MapKeyDataOnlyByteSize(key_field, key);
  size += MapValueRefDataOnlyByteSize(value_field, value);
  target = stream->EnsureSpace(target);
  target = WireFormatLite::WriteTagToArray(
      field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
  target = io::CodedOutputStream::WriteVarint32ToArray(size, target);
  target = SerializeMapKeyWithCachedSizes(key_field, key, target, stream);
  target =
      SerializeMapValueRefWithCachedSizes(value_field, value, target, stream);
  return target;
}